

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::
     Test_TemplateDictionary_TestShowTemplateGlobalSection_SectionDoesntExist::Run(void)

{
  TemplateString local_118;
  string local_f8 [8];
  string out;
  TemplateString local_d8;
  TemplateDictionary local_b8 [8];
  TemplateDictionary dict;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString(&local_28,"test3.tpl");
  ctemplate::TemplateString::TemplateString(&local_48,"{{#bad}}bad{{/bad}}");
  ctemplate::StringToTemplateCache(&local_28,&local_48,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString(&local_d8,"mydict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_b8,&local_d8,(UnsafeArena *)0x0);
  std::__cxx11::string::string(local_f8);
  ctemplate::TemplateString::TemplateString(&local_118,"test3.tpl");
  ctemplate::ExpandTemplate
            (&local_118,DO_NOT_STRIP,(TemplateDictionaryInterface *)local_b8,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
  return;
}

Assistant:

TEST(TemplateDictionary, TestShowTemplateGlobalSection_SectionDoesntExist) {
  StringToTemplateCache("test3.tpl",
                        "{{#bad}}bad{{/bad}}",
                        DO_NOT_STRIP);

  TemplateDictionary dict("mydict");

  string out;
  ExpandTemplate("test3.tpl", DO_NOT_STRIP, &dict, &out);
}